

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O1

SDL_Surface * GPU_LoadSurface_RW(SDL_RWops *rwops,_Bool free_rwops)

{
  undefined1 uVar1;
  int len;
  stbi_uc *psVar2;
  stbi_uc *retval_from_stbi_load;
  SDL_Surface *pSVar3;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  int channels;
  int height;
  int width;
  undefined1 local_438 [1032];
  
  if (rwops == (SDL_RWops *)0x0) {
    pSVar3 = (SDL_Surface *)0x0;
    GPU_PushErrorCode("GPU_LoadSurface_RW",GPU_ERROR_NULL_ARGUMENT,"rwops");
  }
  else {
    SDL_RWseek(rwops,0,0);
    len = SDL_RWseek(rwops,0,2);
    SDL_RWseek(rwops,0,0);
    psVar2 = (stbi_uc *)SDL_malloc((long)len);
    SDL_RWread(rwops,psVar2,1,(long)len);
    retval_from_stbi_load = stbi_load_from_memory(psVar2,len,&width,&height,&channels,0);
    SDL_free(psVar2);
    if (free_rwops) {
      SDL_RWclose(rwops);
    }
    if (retval_from_stbi_load == (stbi_uc *)0x0) {
      pcVar5 = stbi_failure_reason();
      pSVar3 = (SDL_Surface *)0x0;
      GPU_PushErrorCode("GPU_LoadSurface_RW",GPU_ERROR_DATA_ERROR,"Failed to load from rwops: %s",
                        pcVar5);
    }
    else {
      if (channels - 1U < 4) {
        uVar6 = (ulong)(channels - 1U);
        pSVar3 = (SDL_Surface *)
                 SDL_CreateRGBSurface
                           (0,width,(ulong)(uint)height,channels * 8,
                            *(undefined4 *)(&DAT_001ca500 + uVar6 * 4),
                            *(undefined4 *)(&DAT_001ca510 + uVar6 * 4),
                            *(undefined4 *)(&DAT_001ca520 + uVar6 * 4),
                            *(undefined4 *)(&DAT_001ca530 + uVar6 * 4));
        if (pSVar3 == (SDL_Surface *)0x0) {
          pSVar3 = (SDL_Surface *)0x0;
          GPU_PushErrorCode("gpu_copy_raw_surface_data",GPU_ERROR_DATA_ERROR,
                            "Failed to create new %dx%d surface",(ulong)(uint)width,
                            (ulong)(uint)height);
        }
        else {
          if (0 < height) {
            uVar6 = 0;
            psVar2 = retval_from_stbi_load;
            do {
              memcpy((void *)((long)pSVar3->pitch * uVar6 + (long)pSVar3->pixels),psVar2,
                     (long)(channels * width));
              uVar6 = uVar6 + 1;
              psVar2 = psVar2 + channels * width;
            } while ((uint)height != uVar6);
          }
          if (pSVar3->format->palette != (SDL_Palette *)0x0) {
            lVar4 = 0;
            do {
              uVar1 = (undefined1)lVar4;
              local_438[lVar4 * 4 + 2] = uVar1;
              local_438[lVar4 * 4 + 1] = uVar1;
              local_438[lVar4 * 4] = uVar1;
              lVar4 = lVar4 + 1;
            } while (lVar4 != 0x100);
            SDL_SetPaletteColors(pSVar3->format->palette,local_438,0,0x100);
          }
        }
      }
      else {
        pSVar3 = (SDL_Surface *)0x0;
        GPU_PushErrorCode("gpu_copy_raw_surface_data",GPU_ERROR_DATA_ERROR,
                          "Invalid number of channels: %d",(ulong)(uint)channels);
      }
      stbi_image_free(retval_from_stbi_load);
    }
  }
  return pSVar3;
}

Assistant:

SDL_Surface* GPU_LoadSurface_RW(SDL_RWops* rwops, GPU_bool free_rwops)
{
    int width, height, channels;
    unsigned char* data;
    SDL_Surface* result;
    
    int data_bytes;
    unsigned char* c_data;

    if(rwops == NULL)
    {
        GPU_PushErrorCode(__func__, GPU_ERROR_NULL_ARGUMENT, "rwops");
        return NULL;
    }

    // Get count of bytes
    SDL_RWseek(rwops, 0, SEEK_SET);
    data_bytes = (int)SDL_RWseek(rwops, 0, SEEK_END);
    SDL_RWseek(rwops, 0, SEEK_SET);
    
    // Read in the rwops data
    c_data = (unsigned char*)SDL_malloc(data_bytes);
    SDL_RWread(rwops, c_data, 1, data_bytes);
    
    // Load image
    data = stbi_load_from_memory(c_data, data_bytes, &width, &height, &channels, 0);
    
    // Clean up temp data
    SDL_free(c_data);
    if(free_rwops)
        SDL_RWclose(rwops);

    if(data == NULL)
    {
        GPU_PushErrorCode(__func__, GPU_ERROR_DATA_ERROR, "Failed to load from rwops: %s", stbi_failure_reason());
        return NULL;
    }

    // Copy into a surface
    result = gpu_copy_raw_surface_data(data, width, height, channels);

    stbi_image_free(data);

    return result;
}